

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain_struct
          (CompilerHLSL *this,string *lhs,SPIRAccessChain *chain)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  TypedID<(spirv_cross::Types)1> *pTVar4;
  undefined1 local_140 [68];
  uint32_t local_fc;
  SPIRType *local_f8;
  SPIRType *member_type;
  uint32_t local_dc;
  uint local_d8;
  uint32_t offset;
  uint32_t i;
  uint32_t member_count;
  SPIRAccessChain subchain;
  SPIRType *type;
  SPIRAccessChain *chain_local;
  string *lhs_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  subchain.implied_read_expressions.stack_storage.aligned_char._24_8_ =
       Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  SPIRAccessChain::SPIRAccessChain((SPIRAccessChain *)&i,chain);
  sVar3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                    ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                     (subchain.implied_read_expressions.stack_storage.aligned_char._24_8_ + 0x88));
  offset = (uint32_t)sVar3;
  for (local_d8 = 0; local_d8 < offset; local_d8 = local_d8 + 1) {
    local_dc = Compiler::type_struct_member_offset
                         ((Compiler *)this,
                          (SPIRType *)
                          subchain.implied_read_expressions.stack_storage.aligned_char._24_8_,
                          local_d8);
    subchain._80_4_ = chain->static_index + local_dc;
    pTVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                        (subchain.implied_read_expressions.stack_storage.aligned_char._24_8_ + 0x88)
                        ,(ulong)local_d8);
    subchain.super_IVariant._vptr_IVariant._4_4_ = pTVar4->id;
    subchain.static_index = 0;
    subchain.loaded_from.id = 0;
    subchain.matrix_stride._0_1_ = 0;
    uVar2 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)((long)&subchain.super_IVariant._vptr_IVariant + 4));
    local_f8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    if (1 < local_f8->columns) {
      subchain.static_index =
           Compiler::type_struct_member_matrix_stride
                     ((Compiler *)this,
                      (SPIRType *)
                      subchain.implied_read_expressions.stack_storage.aligned_char._24_8_,local_d8);
      local_fc = (uint32_t)
                 TypedID::operator_cast_to_TypedID
                           ((TypedID *)
                            (subchain.implied_read_expressions.stack_storage.aligned_char._24_8_ + 8
                            ));
      subchain.matrix_stride._0_1_ =
           Compiler::has_member_decoration
                     ((Compiler *)this,(TypeID)local_fc,local_d8,DecorationRowMajor);
    }
    bVar1 = VectorView<unsigned_int>::empty(&(local_f8->array).super_VectorView<unsigned_int>);
    if (!bVar1) {
      subchain.loaded_from.id =
           Compiler::type_struct_member_array_stride
                     ((Compiler *)this,
                      (SPIRType *)
                      subchain.implied_read_expressions.stack_storage.aligned_char._24_8_,local_d8);
    }
    CompilerGLSL::to_member_name_abi_cxx11_
              ((CompilerGLSL *)local_140,(SPIRType *)this,
               subchain.implied_read_expressions.stack_storage.aligned_char._24_4_);
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
              ((spirv_cross *)(local_140 + 0x20),lhs,(char (*) [2])0x4dfd16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
    read_access_chain(this,(string *)0x0,(string *)(local_140 + 0x20),(SPIRAccessChain *)&i);
    ::std::__cxx11::string::~string((string *)(local_140 + 0x20));
    ::std::__cxx11::string::~string((string *)local_140);
  }
  SPIRAccessChain::~SPIRAccessChain((SPIRAccessChain *)&i);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain_struct(const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);
	auto subchain = chain;
	uint32_t member_count = uint32_t(type.member_types.size());

	for (uint32_t i = 0; i < member_count; i++)
	{
		uint32_t offset = type_struct_member_offset(type, i);
		subchain.static_index = chain.static_index + offset;
		subchain.basetype = type.member_types[i];

		subchain.matrix_stride = 0;
		subchain.array_stride = 0;
		subchain.row_major_matrix = false;

		auto &member_type = get<SPIRType>(subchain.basetype);
		if (member_type.columns > 1)
		{
			subchain.matrix_stride = type_struct_member_matrix_stride(type, i);
			subchain.row_major_matrix = has_member_decoration(type.self, i, DecorationRowMajor);
		}

		if (!member_type.array.empty())
			subchain.array_stride = type_struct_member_array_stride(type, i);

		read_access_chain(nullptr, join(lhs, ".", to_member_name(type, i)), subchain);
	}
}